

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UCharCharacterIterator::next32PostInc(UCharCharacterIterator *this)

{
  char16_t cVar1;
  int iVar2;
  char16_t *pcVar3;
  uint local_1c;
  uint16_t __c2;
  UChar32 c;
  UCharCharacterIterator *this_local;
  
  if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).end) {
    pcVar3 = this->text;
    iVar2 = (this->super_CharacterIterator).pos;
    (this->super_CharacterIterator).pos = iVar2 + 1;
    local_1c = (uint)(ushort)pcVar3[iVar2];
    if ((((local_1c & 0xfffffc00) == 0xd800) &&
        ((this->super_CharacterIterator).pos != (this->super_CharacterIterator).end)) &&
       (cVar1 = this->text[(this->super_CharacterIterator).pos], (cVar1 & 0xfc00U) == 0xdc00)) {
      (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + 1;
      local_1c = local_1c * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = 0xffff;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UCharCharacterIterator::next32PostInc() {
    if (pos < end) {
        UChar32 c;
        U16_NEXT(text, pos, end, c);
        return c;
    } else {
        return DONE;
    }
}